

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inherit.cc
# Opt level: O3

void QueryHandler2(string *query)

{
  pointer pcVar1;
  ostream *poVar2;
  undefined ***pppuVar3;
  undefined ***pppuVar4;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  LogText logger;
  string local_a8;
  undefined **local_88;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  int local_68;
  undefined ***local_60;
  undefined ***local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_80;
  local_88 = &PTR__LogText_00104d80;
  local_80._M_impl._M_node._M_size = 0;
  local_68 = 0;
  local_60 = *(undefined ****)(in_FS_OFFSET + -8);
  pppuVar3 = &local_88;
  *(undefined ****)(in_FS_OFFSET + -8) = pppuVar3;
  local_80._M_impl._M_node.super__List_node_base._M_prev =
       local_80._M_impl._M_node.super__List_node_base._M_next;
  local_58 = pppuVar3;
  std::operator+(&local_50,"QueryHandler2 called: ",query);
  LogText::Log(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (query->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + query->_M_string_length);
  std::__cxx11::string::append((char *)&local_a8);
  QueryHandler1(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pppuVar4 = local_60;
  if (local_60 != (undefined ***)0x0 && local_68 == 1) {
    do {
      pppuVar3 = pppuVar4;
      if (*(int *)(pppuVar3 + 4) != 1) break;
      pppuVar4 = (undefined ***)pppuVar3[5];
    } while ((undefined ***)pppuVar3[5] != (undefined ***)0x0);
  }
  pppuVar4 = pppuVar3 + 1;
  while (pppuVar4 = (undefined ***)*pppuVar4, pppuVar4 != pppuVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Available from QueryHandler2: \"",0x1f);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)pppuVar4[2],(long)pppuVar4[3]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  local_88 = &PTR__LogText_00104d80;
  *(undefined ****)(in_FS_OFFSET + -8) = local_60;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_80);
  return;
}

Assistant:

void QueryHandler2(const std::string& query) {
  LogText logger(LogText::InheritType::kNew);
  LogText::Log("QueryHandler2 called: " + query);
  QueryHandler1(query + "!!!");
  for (const auto& line : logger.GetLines()) {
    std::cerr << "Available from QueryHandler2: \"" << line << "\""
              << std::endl;
  }
}